

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

void __thiscall context::generate_labels(context *this)

{
  byte *__s;
  char cVar1;
  uint uVar2;
  byte *pbVar3;
  __hashtable *__h;
  anon_class_8_1_8991fb9c advance;
  string label;
  anon_class_16_2_8ab8cb2f next_line;
  anon_class_8_1_8991fb9c local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  anon_class_16_2_8ab8cb2f local_68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  local_58;
  
  local_90.this = this;
  local_68.this = this;
  local_68.advance.this = this;
  if (this->column == 0 && this->line == 0) {
    this->pc = 8;
    while( true ) {
      __s = (byte *)this->text;
      uVar2 = (uint)(char)*__s;
      if (uVar2 == 0) break;
      pbVar3 = __s;
      if ((uVar2 & 0xffffffdf) - 0x41 < 0x1a) {
        while( true ) {
          cVar1 = (char)uVar2;
          if (((9 < (int)cVar1 - 0x30U) && (0x19 < ((int)cVar1 & 0xffffffdfU) - 0x41)) &&
             (cVar1 != '_')) break;
          generate_labels::anon_class_8_1_8991fb9c::operator()(&local_90);
          pbVar3 = (byte *)this->text;
          uVar2 = (uint)*pbVar3;
        }
        if ((uVar2 & 0xff) == 0x3a) {
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          local_88._M_string_length = 0;
          local_88.field_2._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&local_88,(char *)__s,(long)pbVar3 - (long)__s);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_&,_true>
                    (&local_58,&local_88,&this->pc);
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::allocator<std::pair<std::__cxx11::string_const,long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string_const,long>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::allocator<std::pair<std::__cxx11::string_const,long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->labels,&local_58);
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::~string((string *)&local_88);
        }
      }
      generate_labels::anon_class_16_2_8ab8cb2f::operator()(&local_68);
    }
    this->text = this->text_begin;
    this->line = 0;
    this->column = 0;
    this->pc = 0;
    return;
  }
  __assert_fail("line == 0 && column == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/context.cpp"
                ,0x115,"void context::generate_labels()");
}

Assistant:

void context::generate_labels()
{
    const auto advance = [this] {
        if (*text == ';') {
            pc += 8;
            if (pc % 0x20 == 0) {
                pc += 8;
            }
        }
        next();
    };
    const auto next_line = [this, advance] {
        do {
            advance();
        } while (*text && column > 0);
    };

    assert(line == 0 && column == 0);

    pc = 8;

    while (*text) {
        if (!is_alpha(*text)) {
            next_line();
            continue;
        }
        const char* const potential_label = text;
        while (is_alnum(*text) || *text == '_') {
            advance();
        }
        if (*text == ':') {
            std::string label;
            label.append(potential_label, static_cast<size_t>(text - potential_label));
            labels.insert({std::move(label), pc});
        }
        next_line();
    }

    reset();
}